

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void resizestack(lua_State *L,MSize n)

{
  uint uVar1;
  undefined4 uVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  GCRef *pGVar6;
  ulong uVar7;
  void *p;
  
  uVar7 = (ulong)(L->glref).ptr32;
  p = (void *)(ulong)(L->stack).ptr32;
  uVar1 = L->stacksize;
  uVar2 = *(undefined4 *)(uVar7 + 0x160);
  *(undefined4 *)(uVar7 + 0x160) = 0xffffffff;
  pvVar3 = lj_mem_realloc(L,p,uVar1 * 8,n * 8 + 0x30);
  (L->stack).ptr32 = (uint32_t)pvVar3;
  (L->maxstack).ptr32 = (uint32_t)pvVar3 + n * 8;
  for (uVar7 = (ulong)uVar1; uVar7 < n + 6; uVar7 = uVar7 + 1) {
    *(undefined4 *)((long)pvVar3 + uVar7 * 8 + 4) = 0xffffffff;
  }
  lVar4 = (long)pvVar3 - (long)p;
  L->stacksize = n + 6;
  uVar5 = (ulong)(L->glref).ptr32;
  uVar1 = *(uint *)(uVar5 + 400);
  if ((ulong)uVar1 - (long)p < (uVar7 & 0xffffffff)) {
    *(uint *)(uVar5 + 400) = uVar1 + (int)lVar4;
  }
  L->base = (TValue *)((long)L->base + lVar4);
  L->top = (TValue *)((long)L->top + lVar4);
  pGVar6 = &L->openupval;
  while (pGVar6 = (GCRef *)(ulong)pGVar6->gcptr32, pGVar6 != (GCRef *)0x0) {
    pGVar6[4] = (GCRef)(pGVar6[4].gcptr32 + (int)lVar4);
  }
  *(undefined4 *)((ulong)(L->glref).ptr32 + 0x160) = uVar2;
  return;
}

Assistant:

static void resizestack(lua_State *L, MSize n)
{
  TValue *st, *oldst = tvref(L->stack);
  ptrdiff_t delta;
  MSize oldsize = L->stacksize;
  MSize realsize = n + 1 + LJ_STACK_EXTRA;
  GCobj *up;
  int32_t oldvmstate = G(L)->vmstate;

  lj_assertL((MSize)(tvref(L->maxstack)-oldst) == L->stacksize-LJ_STACK_EXTRA-1,
	     "inconsistent stack size");

  /*
  ** Lua stack is inconsistent while reallocation, profilers
  ** depend on vmstate during reports, so set vmstate to INTERP
  ** to avoid inconsistent behaviour.
  */
  setvmstate(G(L), INTERP);
  st = (TValue *)lj_mem_realloc(L, tvref(L->stack),
				(MSize)(oldsize*sizeof(TValue)),
				(MSize)(realsize*sizeof(TValue)));
  setmref(L->stack, st);
  delta = (char *)st - (char *)oldst;
  setmref(L->maxstack, st + n);
  while (oldsize < realsize)  /* Clear new slots. */
    setnilV(st + oldsize++);
  L->stacksize = realsize;
  if ((size_t)(mref(G(L)->jit_base, char) - (char *)oldst) < oldsize)
    setmref(G(L)->jit_base, mref(G(L)->jit_base, char) + delta);
  L->base = (TValue *)((char *)L->base + delta);
  L->top = (TValue *)((char *)L->top + delta);
  for (up = gcref(L->openupval); up != NULL; up = gcnext(up))
    setmref(gco2uv(up)->v, (TValue *)((char *)uvval(gco2uv(up)) + delta));

  G(L)->vmstate = oldvmstate;
}